

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O2

void av1_idct8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int8_t bit;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  long lVar15;
  long lVar16;
  undefined7 in_register_00000011;
  long lVar17;
  int32_t step [8];
  
  lVar17 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[4];
  output[2] = input[2];
  output[3] = input[6];
  output[4] = input[1];
  output[5] = input[5];
  output[6] = input[3];
  output[7] = input[7];
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x240);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x180);
  lVar15 = 1L << (cos_bit - 1U & 0x3f);
  step[4] = (int32_t)(output[4] * iVar1 + lVar15 + (long)-(iVar2 * output[7]) >> (cos_bit & 0x3fU));
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x1c0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x200);
  step[5] = (int32_t)(output[5] * iVar3 + lVar15 + (long)-(iVar4 * output[6]) >> (cos_bit & 0x3fU));
  step[6] = (int32_t)(iVar4 * output[5] + lVar15 + (long)(output[6] * iVar3) >> (cos_bit & 0x3fU));
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x1a0);
  step[7] = (int32_t)(iVar2 * output[4] + lVar15 + (long)(output[7] * iVar1) >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,8,stage_range[2]);
  iVar14 = step[5];
  iVar11 = step[4];
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x1e0);
  lVar16 = (long)step[0] * (long)iVar1 + lVar15;
  *output = (int32_t)(step[1] * iVar1 + lVar16 >> (cos_bit & 0x3fU));
  output[1] = (int32_t)(step[1] * -iVar1 + lVar16 >> (cos_bit & 0x3fU));
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar17 + 0x220);
  output[2] = (int32_t)(step[2] * iVar2 + lVar15 + (long)-(iVar3 * step[3]) >> (cos_bit & 0x3fU));
  output[3] = (int32_t)(iVar3 * step[2] + lVar15 + (long)(step[3] * iVar2) >> (cos_bit & 0x3fU));
  iVar10 = clamp_value(step[5] + step[4],stage_range[3]);
  output[4] = iVar10;
  iVar10 = clamp_value(iVar11 - iVar14,stage_range[3]);
  iVar14 = step[7];
  iVar11 = step[6];
  output[5] = iVar10;
  iVar10 = clamp_value(step[7] - step[6],stage_range[3]);
  output[6] = iVar10;
  iVar11 = clamp_value(iVar14 + iVar11,stage_range[3]);
  output[7] = iVar11;
  av1_range_check_buf(3,input,output,8,stage_range[3]);
  iVar2 = *output;
  iVar3 = output[3];
  bit = stage_range[4];
  iVar11 = clamp_value(iVar3 + iVar2,bit);
  step[0] = iVar11;
  iVar4 = output[1];
  iVar5 = output[2];
  iVar11 = clamp_value(iVar5 + iVar4,bit);
  step[1] = iVar11;
  iVar11 = clamp_value(iVar4 - iVar5,bit);
  step[2] = iVar11;
  iVar11 = clamp_value(iVar2 - iVar3,bit);
  step[4] = output[4];
  lVar15 = (long)output[6] * (long)iVar1 + lVar15;
  step[5] = (int32_t)(-iVar1 * output[5] + lVar15 >> (cos_bit & 0x3fU));
  step[6] = (int32_t)(output[5] * iVar1 + lVar15 >> (cos_bit & 0x3fU));
  step[7] = output[7];
  step[3] = iVar11;
  av1_range_check_buf(4,input,step,8,bit);
  iVar9 = step[7];
  iVar11 = step[0];
  iVar10 = clamp_value(step[7] + step[0],stage_range[5]);
  iVar8 = step[6];
  iVar14 = step[1];
  *output = iVar10;
  iVar12 = clamp_value(step[6] + step[1],stage_range[5]);
  iVar7 = step[5];
  iVar10 = step[2];
  output[1] = iVar12;
  iVar13 = clamp_value(step[5] + step[2],stage_range[5]);
  iVar6 = step[4];
  iVar12 = step[3];
  output[2] = iVar13;
  iVar13 = clamp_value(step[4] + step[3],stage_range[5]);
  output[3] = iVar13;
  iVar12 = clamp_value(iVar12 - iVar6,stage_range[5]);
  output[4] = iVar12;
  iVar10 = clamp_value(iVar10 - iVar7,stage_range[5]);
  output[5] = iVar10;
  iVar14 = clamp_value(iVar14 - iVar8,stage_range[5]);
  output[6] = iVar14;
  iVar11 = clamp_value(iVar11 - iVar9,stage_range[5]);
  output[7] = iVar11;
  return;
}

Assistant:

void av1_idct8(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 8;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[4];
  bf1[2] = input[2];
  bf1[3] = input[6];
  bf1[4] = input[1];
  bf1[5] = input[5];
  bf1[6] = input[3];
  bf1[7] = input[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
}